

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diner-demo.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  dining_policy_t dVar4;
  pthread_t __target_thread;
  fork_t *right;
  fork_t *left;
  fork_t *pfVar5;
  diner_t *diner_00;
  int id1;
  uint uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  int i_1;
  ulong uVar9;
  undefined1 local_1e8 [12];
  sched_param sched_parameters;
  Configuration config;
  diner_t diner [5];
  fork_t fork [5];
  diner_t *diner_01;
  
  diner_00 = (diner_t *)local_1e8;
  diner_01 = (diner_t *)local_1e8;
  config.num_philosophers = 5;
  config.think_time = 2;
  config.eat_time = 3;
  config.enumerate_resources = 0;
  parseCommandLine(argc,argv,&config);
  printf("Number of Philosophers: %d\n",config._0_8_ & 0xffffffff);
  printf("Think Time: %d seconds\n",(ulong)config._0_8_ >> 0x20);
  printf("Eat Time: %d seconds\n",config._8_8_ & 0xffffffff);
  printf("Enumerate Resources: %s\n");
  __target_thread = pthread_self();
  sched_parameters.sched_priority = sched_get_priority_max(0);
  iVar3 = pthread_setschedparam(__target_thread,0,(sched_param *)&sched_parameters);
  if (iVar3 == 0) {
    pfVar5 = fork;
    for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
      fork_init(pfVar5,(int)lVar8);
      pfVar5 = pfVar5 + 1;
    }
    pfVar5 = fork;
    uVar9 = 0;
    while (diner_00 = diner_00 + 1, uVar9 != 5) {
      uVar1 = uVar9 + 1;
      uVar6 = (uint)uVar1;
      if (uVar1 == 5) {
        uVar6 = 0;
      }
      dVar4 = get_dining_policy();
      uVar7 = (ulong)uVar6;
      if (uVar7 < uVar9 && dVar4 == FORK_REORDERING) {
        printf("Reordered forks %d and %d\n",uVar9 & 0xffffffff,uVar7);
        right = pfVar5;
        left = fork + uVar7;
      }
      else {
        right = fork + uVar7;
        left = pfVar5;
      }
      diner_init(diner_00,(int)uVar9,left,right);
      pfVar5 = pfVar5 + 1;
      uVar9 = uVar1;
    }
    for (uVar9 = 0; diner_01 = diner_01 + 1, uVar9 != 5; uVar9 = uVar9 + 1) {
      printf("Creating thread %d",uVar9 & 0xffffffff);
      diner_start(diner_01);
    }
    bVar2 = true;
    while (lVar8 = 1, bVar2) {
      for (; lVar8 != 0xa1; lVar8 = lVar8 + 0x20) {
        putchar((int)(&diner[0].id)[lVar8]);
      }
      putchar(10);
      bVar2 = false;
      for (lVar8 = 1; lVar8 != 0xa1; lVar8 = lVar8 + 0x20) {
        bVar2 = (bool)(bVar2 | (&diner[0].id)[lVar8] != 'd');
      }
      millisecond_sleep(0x33);
    }
    for (lVar8 = 0; lVar8 != 0xa0; lVar8 = lVar8 + 0x20) {
      diner_await((diner_t *)(&diner[0].id + lVar8));
      printf("Diner id %c exited normally; state = %c\n",
             (ulong)(uint)(int)((diner_t *)(&diner[0].id + lVar8))->id,
             (ulong)(uint)(int)(&diner[0].state)[lVar8]);
    }
    for (lVar8 = 0; lVar8 != 0xf0; lVar8 = lVar8 + 0x30) {
      fork_free_resources((fork_t *)(&fork[0].id + lVar8));
    }
    return 0;
  }
  fwrite("Cannot set main thread max prioirty. Fatal.\n",0x2c,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    Configuration config = {
        .num_philosophers = 5,      // default number of philosophers
        .think_time = 2,            // default think time in seconds
        .eat_time = 3,              // default eat time in seconds
        .enumerate_resources = 0    // default for resource enumeration: off
    };

    parseCommandLine(argc, argv, &config);

    printf("Number of Philosophers: %d\n", config.num_philosophers);
    printf("Think Time: %d seconds\n", config.think_time);
    printf("Eat Time: %d seconds\n", config.eat_time);
    printf("Enumerate Resources: %s\n", config.enumerate_resources ? "Yes" : "No");

    fork_t fork[MAX_DINERS];
    diner_t diner[MAX_DINERS];

    /* The main thread  */
    pthread_t this_thread = pthread_self();
    struct sched_param sched_parameters;
    sched_parameters.sched_priority = sched_get_priority_max(SCHED_OTHER);
    int status = pthread_setschedparam(this_thread, SCHED_OTHER, &sched_parameters);

    // the main thread monitors the state of the diners and runs at highest
    // priority so it can continue doing something, even if (or when) the other
    // threads get deadlocked.

    if (status != 0)
    {
        fprintf(stderr, "Cannot set main thread max prioirty. Fatal.\n");
        exit(1);
    }

    /* initialize the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_init(&fork[i], i);

    /* initialize the diners to link to the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        int id1 = i;
        int id2 = (i + 1) % MAX_DINERS;
        if (get_dining_policy() == FORK_REORDERING && id1 > id2)
        {
            printf("Reordered forks %d and %d\n", id1, id2);
            diner_init(&diner[i], i, &fork[id2], &fork[id1]);
        }
        else
        {
            diner_init(&diner[i], i, &fork[id1], &fork[id2]);
        }
    }

    /* start the actual threads for each diner */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        printf("Creating thread %d", i);
        diner_start(&diner[i]);
    }

    /* monitor the state of the diners in the main (highest-priority) thread
     * because it is high priority, it must sleep for a short time to give
     * the diner threads a chance to do their thing.
     */
    int go_on = 1;
    while (go_on)
    {
        for (int i = 0; i < MAX_DINERS; i++)
        {
            putchar(diner[i].state);
        }
        putchar('\n');
        go_on = 0;
        for (int i = 0; i < MAX_DINERS; i++)
        {
            go_on |= diner[i].state != 'd';
        }
        millisecond_sleep(MAIN_THREAD_SLEEP_TIME);
    }

    /* assuming no deadlock happened, this code will be reached so we
     * can join with the main thread
     */

    for (int i=0; i < MAX_DINERS; i++)
    {
        diner_await(&diner[i]);
        printf("Diner id %c exited normally; state = %c\n", diner[i].id, diner[i].state);
    }

    /* locks associated with forks need to be cleaned up */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_free_resources(&fork[i]);

    /* attribute object should also be freed (could do earlier, too) */
    //pthread_attr_destroy(&attr);
}